

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# render.hpp
# Opt level: O2

Image4u * eos::render::render(Image4u *__return_storage_ptr__,Mesh *mesh,Matrix4f *model_view_matrix
                             ,Matrix4f *projection_matrix,int viewport_width,int viewport_height,
                             Texture *texture,bool enable_backface_culling,bool enable_near_clipping
                             ,bool enable_far_clipping)

{
  SoftwareRenderer<eos::render::VertexShader,_eos::render::TexturingFragmentShader>
  software_renderer;
  _Optional_payload_base<eos::render::Texture> local_f0;
  SoftwareRenderer<eos::render::VertexShader,_eos::render::TexturingFragmentShader> local_c8;
  
  SoftwareRenderer<eos::render::VertexShader,_eos::render::TexturingFragmentShader>::
  SoftwareRenderer(&local_c8,viewport_width,viewport_height);
  local_c8.enable_backface_culling = enable_backface_culling;
  local_c8.enable_near_clipping = enable_near_clipping;
  local_c8.rasterizer.enable_far_clipping = enable_far_clipping;
  std::_Optional_payload_base<eos::render::Texture>::_Optional_payload_base<eos::render::Texture&>
            (&local_f0,texture);
  SoftwareRenderer<eos::render::VertexShader,_eos::render::TexturingFragmentShader>::render<float>
            (__return_storage_ptr__,&local_c8,mesh,model_view_matrix,projection_matrix,
             (optional<eos::render::Texture> *)&local_f0);
  std::_Optional_payload_base<eos::render::Texture>::_M_reset(&local_f0);
  SoftwareRenderer<eos::render::VertexShader,_eos::render::TexturingFragmentShader>::
  ~SoftwareRenderer(&local_c8);
  return __return_storage_ptr__;
}

Assistant:

core::Image4u render(const core::Mesh& mesh, const Eigen::Matrix4f& model_view_matrix,
                     const Eigen::Matrix4f& projection_matrix, int viewport_width, int viewport_height,
                     Texture texture, bool enable_backface_culling = false, bool enable_near_clipping = true,
                     bool enable_far_clipping = true)
{
    SoftwareRenderer<VertexShader, TexturingFragmentShader> software_renderer(viewport_width,
                                                                              viewport_height);
    software_renderer.enable_backface_culling = enable_backface_culling;
    software_renderer.enable_near_clipping = enable_near_clipping;
    software_renderer.rasterizer.enable_far_clipping = enable_far_clipping;

    return software_renderer.render(mesh, model_view_matrix, projection_matrix, texture);
}